

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  char *pcVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  int *piVar7;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar8;
  __sighandler_t p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  const_iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  Arguments args;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string filter_flag;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  int local_20c;
  int local_208;
  int local_204;
  string local_200;
  string local_1e0;
  char *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  _union_1457 local_180;
  undefined1 local_178 [8];
  ulong local_170;
  ulong uStack_168;
  _union_1457 local_e8;
  long local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_204 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar3 = pipe(&local_20c);
  if (iVar3 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_310 == puVar8) {
      local_300 = *puVar8;
      lStack_2f8 = puVar6[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar8;
    }
    local_308 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar5 + 2);
    if (local_2d0 == paVar15) {
      local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2c0._8_8_ = plVar5[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_2c8 = plVar5[1];
    *plVar5 = (long)paVar15;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_270._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>(&local_290,(int *)&local_270);
    uVar14 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar14 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_2c8) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar14 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_290._M_string_length + local_2c8) goto LAB_00149536;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_00149536:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar6;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar15) {
      local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar6[1];
    *puVar6 = paVar15;
    puVar6[1] = 0;
    paVar15->_M_local_buf[0] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_180.sa_handler = (__sighandler_t)*puVar6;
    p_Var9 = (__sighandler_t)(puVar6 + 2);
    if (local_180.sa_handler == p_Var9) {
      local_170 = *(ulong *)p_Var9;
      uStack_168 = puVar6[3];
      local_180.sa_handler = (__sighandler_t)&local_170;
    }
    else {
      local_170 = *(ulong *)p_Var9;
    }
    local_178 = (undefined1  [8])puVar6[1];
    *puVar6 = p_Var9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
    local_e8.sa_handler = (__sighandler_t)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler == paVar10) {
      local_d8[0]._0_8_ = paVar10->_M_allocated_capacity;
      local_d8[0]._8_8_ = puVar6[3];
      local_e8.sa_handler = (__sighandler_t)local_d8;
    }
    else {
      local_d8[0]._0_8_ = paVar10->_M_allocated_capacity;
    }
    local_e0 = puVar6[1];
    *puVar6 = paVar10;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    DeathTestAbort((string *)&local_e8);
    puVar6 = extraout_RAX_02;
    local_e8 = extraout_RDX_02;
LAB_00149f66:
    local_d8[0]._0_8_ = paVar10->_M_allocated_capacity;
  }
  else {
    iVar3 = fcntl(local_208,2,0);
    if (iVar3 != -1) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = &local_300;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_300 = *puVar8;
        lStack_2f8 = plVar5[3];
      }
      else {
        local_300 = *puVar8;
        local_310 = (ulong *)*plVar5;
      }
      local_308 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = &local_2c0;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar15) {
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2c0._8_8_ = plVar5[3];
      }
      else {
        local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
      }
      local_2c8 = plVar5[1];
      *plVar5 = (long)paVar15;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar15) {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar5[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_2b0._M_string_length = plVar5[1];
      *plVar5 = (long)paVar15;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_180.sa_handler = (__sighandler_t)&local_170;
      p_Var9 = (__sighandler_t)(plVar5 + 2);
      if ((__sighandler_t)*plVar5 == p_Var9) {
        local_170 = *(ulong *)p_Var9;
        uStack_168 = plVar5[3];
      }
      else {
        local_170 = *(ulong *)p_Var9;
        local_180.sa_handler = (__sighandler_t)*plVar5;
      }
      local_178 = (undefined1  [8])plVar5[1];
      *plVar5 = (long)p_Var9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar15) {
        local_d8[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar6[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar15->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar6;
      }
      local_e0 = puVar6[1];
      *puVar6 = paVar15;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_e8);
      paVar15 = &local_40;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar10) {
        local_40._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_40._8_8_ = plVar5[3];
        local_50 = paVar15;
      }
      else {
        local_40._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)paVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_180.sa_handler != (__sighandler_t)&local_170) {
        operator_delete(local_180.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_250.field_2._M_allocated_capacity = *puVar8;
        local_250.field_2._8_8_ = plVar5[3];
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar8;
        local_250._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_250._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_270.field_2._M_allocated_capacity = *puVar8;
        local_270.field_2._8_8_ = plVar5[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar8;
        local_270._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_270._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_290.field_2._M_allocated_capacity = *puVar8;
        local_290.field_2._8_8_ = plVar5[3];
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar8;
        local_290._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_290._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar10) {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e0._8_8_ = plVar5[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar5;
      }
      local_2e8 = plVar5[1];
      *plVar5 = (long)paVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = &local_300;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_300 = *puVar8;
        lStack_2f8 = plVar5[3];
      }
      else {
        local_300 = *puVar8;
        local_310 = (ulong *)*plVar5;
      }
      local_308 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      StreamableToString<int>(&local_200,&this->line_);
      uVar13 = 0xf;
      if (local_310 != &local_300) {
        uVar13 = local_300;
      }
      if (uVar13 < local_200._M_string_length + local_308) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          uVar14 = local_200.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_200._M_string_length + local_308) goto LAB_00148115;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_310);
      }
      else {
LAB_00148115:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_310,(ulong)local_200._M_dataplus._M_p);
      }
      local_2d0 = &local_2c0;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2c0._8_8_ = puVar6[3];
      }
      else {
        local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
      }
      local_2c8 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar6[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_2b0._M_string_length = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      StreamableToString<int>(&local_1e0,&local_204);
      uVar13 = CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length) +
               local_2b0._M_string_length;
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar14 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < uVar13) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          uVar14 = local_1e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < uVar13) goto LAB_0014823c;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_0014823c:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_1e0._M_dataplus._M_p);
      }
      local_180.sa_handler = (__sighandler_t)&local_170;
      p_Var9 = (__sighandler_t)(puVar6 + 2);
      if ((__sighandler_t)*puVar6 == p_Var9) {
        local_170 = *(ulong *)p_Var9;
        uStack_168 = puVar6[3];
      }
      else {
        local_170 = *(ulong *)p_Var9;
        local_180.sa_handler = (__sighandler_t)*puVar6;
      }
      local_178 = (undefined1  [8])puVar6[1];
      *puVar6 = p_Var9;
      puVar6[1] = 0;
      *p_Var9 = (__sighandler_t)0x0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_d8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_d8[0]._8_8_ = puVar6[3];
        local_e8.sa_handler = (__sighandler_t)local_d8;
      }
      else {
        local_d8[0]._0_8_ = paVar10->_M_allocated_capacity;
        local_e8.sa_handler = (__sighandler_t)*puVar6;
      }
      local_e0 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      StreamableToString<int>(&local_1a0,&local_208);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        uVar14 = local_d8[0]._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_e0 + local_1a0._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
            &local_1a0.field_2) {
          uVar14 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_e0 + local_1a0._M_string_length) goto LAB_00148382;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_00148382:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_e8,
                            (ulong)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                            local_1a0._M_dataplus._M_p._0_4_));
      }
      local_1c0 = (char *)&local_1b0;
      pcVar1 = (char *)(puVar6 + 2);
      if ((char *)*puVar6 == pcVar1) {
        local_1b0 = *(undefined8 *)pcVar1;
        uStack_1a8 = puVar6[3];
      }
      else {
        local_1b0 = *(undefined8 *)pcVar1;
        local_1c0 = (char *)*puVar6;
      }
      local_1b8 = puVar6[1];
      *puVar6 = pcVar1;
      puVar6[1] = 0;
      *pcVar1 = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
          &local_1a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_))
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      if (local_180.sa_handler != (__sighandler_t)&local_170) {
        operator_delete(local_180.sa_handler);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      Arguments::Arguments((Arguments *)&local_200);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_e8,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_200,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e8);
      __position._M_current = (char **)(local_200._M_string_length - 8);
      local_e8.sa_handler = (__sighandler_t)strdup(local_50->_M_local_buf);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_200,__position,
                 (value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)strdup(local_1c0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_200,
                 (char **)(local_200._M_string_length - 8),(value_type *)&local_e8.sa_handler);
      local_e8.sa_handler = (__sighandler_t)local_d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.sa_handler != local_d8) {
        operator_delete(local_e8.sa_handler);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e0._M_dataplus._M_p = local_200._M_dataplus._M_p;
      local_1e0._M_string_length._0_4_ = local_20c;
      memset(&local_180,0,0x98);
      sigemptyset((sigset_t *)local_178);
      local_180 = (_union_1457)0x1;
      do {
        iVar3 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)&local_e8);
        if (iVar3 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar3 = fork();
            if (iVar3 == 0) {
              ExecDeathTestChildMain(&local_1e0);
              goto LAB_00148dee;
            }
LAB_001487cd:
            goto LAB_001487d5;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_00148dee:
            AssumeRole();
          }
          iVar3 = getpagesize();
          __len = (size_t)(iVar3 * 2);
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CHECK failed: File ","");
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
            local_290._M_dataplus._M_p = (pointer)*puVar6;
            puVar8 = puVar6 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar8) {
              local_290.field_2._M_allocated_capacity = *puVar8;
              local_290.field_2._8_8_ = puVar6[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar8;
            }
            local_290._M_string_length = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = &local_2e0;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar6 + 2);
            if (paVar10 != paVar11) goto LAB_00149866;
            local_2e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2e0._8_8_ = puVar6[3];
            goto LAB_00149873;
          }
          lVar12 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar12 = __len - 0x40;
          }
          if (((uint)(iVar3 * 2) < 0x41) || (((ulong)(lVar12 + (long)__addr) & 0x3f) != 0)) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CHECK failed: File ","");
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
            local_290._M_dataplus._M_p = (pointer)*puVar6;
            puVar8 = puVar6 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar8) {
              local_290.field_2._M_allocated_capacity = *puVar8;
              local_290.field_2._8_8_ = puVar6[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar8;
            }
            local_290._M_string_length = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar6;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar6 + 2);
            if (local_2f0 == paVar10) {
              local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_2e0._8_8_ = puVar6[3];
              local_2f0 = &local_2e0;
            }
            else {
              local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_2e8 = puVar6[1];
            *puVar6 = paVar10;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            local_230._M_dataplus._M_p._0_4_ = 0x569;
            StreamableToString<int>(&local_250,(int *)&local_230);
            uVar14 = 0xf;
            if (local_2f0 != &local_2e0) {
              uVar14 = local_2e0._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_250._M_string_length + local_2e8) {
              uVar14 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                uVar14 = local_250.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar14 < local_250._M_string_length + local_2e8) goto LAB_001499a9;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
            }
            else {
LAB_001499a9:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
            }
            local_310 = (ulong *)*puVar6;
            puVar8 = puVar6 + 2;
            if (local_310 == puVar8) {
              local_300 = *puVar8;
              lStack_2f8 = puVar6[3];
              local_310 = &local_300;
            }
            else {
              local_300 = *puVar8;
            }
            local_308 = puVar6[1];
            *puVar6 = puVar8;
            puVar6[1] = 0;
            *(undefined1 *)puVar8 = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
            local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar6;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar6 + 2);
            if (local_2d0 == paVar10) {
              local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_2c0._8_8_ = puVar6[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            }
            local_2c8 = puVar6[1];
            *puVar6 = paVar10;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar6 + 2);
            if (paVar10 != paVar11) goto LAB_0014a11f;
            local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = puVar6[3];
            goto LAB_0014a12c;
          }
          iVar3 = clone(ExecDeathTestChildMain,(void *)(lVar12 + (long)__addr),0x11,&local_1e0);
          iVar4 = munmap(__addr,__len);
          if (iVar4 != -1) goto LAB_001487cd;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"CHECK failed: File ","");
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
          local_290._M_dataplus._M_p = (pointer)*puVar6;
          puVar8 = puVar6 + 2;
          if ((ulong *)local_290._M_dataplus._M_p == puVar8) {
            local_290.field_2._M_allocated_capacity = *puVar8;
            local_290.field_2._8_8_ = puVar6[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar8;
          }
          local_290._M_string_length = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if (local_2f0 == paVar10) {
            local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2e0._8_8_ = puVar6[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_2e8 = puVar6[1];
          *puVar6 = paVar10;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x56d;
          StreamableToString<int>(&local_250,(int *)&local_230);
          uVar14 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar14 = local_2e0._M_allocated_capacity;
          }
          if ((ulong)uVar14 < local_250._M_string_length + local_2e8) {
            uVar14 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              uVar14 = local_250.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar14 < local_250._M_string_length + local_2e8) goto LAB_00149a52;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_00149a52:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_310 == puVar8) {
            local_300 = *puVar8;
            lStack_2f8 = puVar6[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar8;
          }
          local_308 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)puVar8 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar6;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if (local_2d0 == paVar10) {
            local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2c0._8_8_ = puVar6[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_2c8 = puVar6[1];
          *puVar6 = paVar10;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar6;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if (paVar10 != paVar11) goto LAB_0014a14d;
          local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = puVar6[3];
          goto LAB_0014a15a;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_270._M_dataplus._M_p = (pointer)*puVar6;
      puVar8 = puVar6 + 2;
      if ((ulong *)local_270._M_dataplus._M_p == puVar8) {
        local_270.field_2._M_allocated_capacity = *puVar8;
        local_270.field_2._8_8_ = puVar6[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar8;
      }
      local_270._M_string_length = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)*puVar6;
      puVar8 = puVar6 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar8) {
        local_290.field_2._M_allocated_capacity = *puVar8;
        local_290.field_2._8_8_ = puVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar8;
      }
      local_290._M_string_length = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_1a0._M_dataplus._M_p._0_4_ = 0x54f;
      StreamableToString<int>(&local_230,(int *)&local_1a0);
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar14 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar14 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length)
        goto LAB_00148b41;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
      }
      else {
LAB_00148b41:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
      }
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if (local_2f0 == paVar10) {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e0._8_8_ = puVar6[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2e8 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_310 == puVar8) {
        local_300 = *puVar8;
        lStack_2f8 = puVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar8;
      }
      local_308 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if (local_2d0 == paVar10) {
        local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2c0._8_8_ = puVar6[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2c8 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar6;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar11) {
        local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar6[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar6[1];
      *puVar6 = paVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar6 = extraout_RAX;
      paVar10 = extraout_RDX;
      goto LAB_00149801;
    }
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_310 == puVar8) {
      local_300 = *puVar8;
      lStack_2f8 = puVar6[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar8;
    }
    local_308 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if (local_2d0 == paVar15) {
      local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2c0._8_8_ = puVar6[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_2c8 = puVar6[1];
    *puVar6 = paVar15;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_270._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>(&local_290,(int *)&local_270);
    uVar14 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar14 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_290._M_string_length + local_2c8) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar14 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_290._M_string_length + local_2c8) goto LAB_001495da;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_001495da:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar6;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar15) {
      local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar6[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar6[1];
    *puVar6 = paVar15;
    puVar6[1] = 0;
    paVar15->_M_local_buf[0] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_180.sa_handler = (__sighandler_t)*puVar6;
    p_Var9 = (__sighandler_t)(puVar6 + 2);
    if (local_180.sa_handler == p_Var9) {
      local_170 = *(ulong *)p_Var9;
      uStack_168 = puVar6[3];
      local_180.sa_handler = (__sighandler_t)&local_170;
    }
    else {
      local_170 = *(ulong *)p_Var9;
    }
    local_178 = (undefined1  [8])puVar6[1];
    *puVar6 = p_Var9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
    local_e8.sa_handler = (__sighandler_t)*puVar6;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.sa_handler != paVar10) goto LAB_00149f66;
    local_d8[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_d8[0]._8_8_ = puVar6[3];
    local_e8.sa_handler = (__sighandler_t)local_d8;
  }
  paVar15 = &local_2c0;
  local_e0 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar6 = extraout_RAX_03;
  local_2d0 = extraout_RDX_03;
  goto LAB_00149f9d;
LAB_0014886c:
  do {
    iVar4 = close(local_208);
    if (iVar4 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar3;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_20c;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_200);
      if (local_1c0 != (char *)&local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_50 != paVar15) {
        operator_delete(local_50);
      }
      return OVERSEE_TEST;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if (local_2f0 == paVar10) {
    local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e0._8_8_ = puVar6[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2e8 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_310 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = puVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_250._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_270,(int *)&local_250);
  uVar13 = 0xf;
  if (local_310 != &local_300) {
    uVar13 = local_300;
  }
  if (uVar13 < local_270._M_string_length + local_308) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar14 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_270._M_string_length + local_308) goto LAB_00148cae;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_00148cae:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_270._M_dataplus._M_p);
  }
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if (local_2d0 == paVar10) {
    local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2c0._8_8_ = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2c8 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  paVar10->_M_local_buf[0] = '\0';
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar6;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar6[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_180.sa_handler = (__sighandler_t)*plVar5;
  p_Var9 = (__sighandler_t)(plVar5 + 2);
  if (local_180.sa_handler == p_Var9) {
    local_170 = *(ulong *)p_Var9;
    uStack_168 = plVar5[3];
    local_180.sa_handler = (__sighandler_t)&local_170;
  }
  else {
    local_170 = *(ulong *)p_Var9;
  }
  local_178 = (undefined1  [8])plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
  local_e8.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.sa_handler != paVar11) goto LAB_0014982f;
  local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
  local_d8[0]._8_8_ = puVar6[3];
  local_e8.sa_handler = (__sighandler_t)local_d8;
  goto LAB_00149842;
  while (piVar7 = __errno_location(), *piVar7 == 4) {
LAB_001487d5:
    iVar4 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)0x0);
    if (iVar4 != -1) {
      if (iVar3 != -1) goto LAB_0014886c;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)*puVar6;
      puVar8 = puVar6 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar8) {
        local_290.field_2._M_allocated_capacity = *puVar8;
        local_290.field_2._8_8_ = puVar6[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar8;
      }
      local_290._M_string_length = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if (local_2f0 == paVar10) {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2e0._8_8_ = puVar6[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2e8 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_250,(int *)&local_230);
      uVar14 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar14 = local_2e0._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_250._M_string_length + local_2e8) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          uVar14 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_250._M_string_length + local_2e8) goto LAB_001497c4;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_001497c4:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_310 == puVar8) {
        local_300 = *puVar8;
        lStack_2f8 = puVar6[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar8;
      }
      local_308 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar6;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if (local_2d0 == paVar10) {
        local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2c0._8_8_ = puVar6[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2c8 = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*plVar5;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar11) {
        local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar5[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_2b0._M_string_length = plVar5[1];
      *plVar5 = (long)paVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar6 = extraout_RAX_04;
      local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_0014a0f1;
    }
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_270._M_dataplus._M_p = (pointer)*puVar6;
  puVar8 = puVar6 + 2;
  if ((ulong *)local_270._M_dataplus._M_p == puVar8) {
    local_270.field_2._M_allocated_capacity = *puVar8;
    local_270.field_2._8_8_ = puVar6[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar8;
  }
  local_270._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_290._M_dataplus._M_p = (pointer)*puVar6;
  puVar8 = puVar6 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar8) {
    local_290.field_2._M_allocated_capacity = *puVar8;
    local_290.field_2._8_8_ = puVar6[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar8;
  }
  local_290._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar14 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar14 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_230._M_string_length + local_290._M_string_length) goto LAB_00148c02;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
  }
  else {
LAB_00148c02:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if (local_2f0 == paVar10) {
    local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2e0._8_8_ = puVar6[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2e8 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  paVar10->_M_local_buf[0] = '\0';
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_310 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = puVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if (local_2d0 == paVar10) {
    local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2c0._8_8_ = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2c8 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if (paVar10 == paVar11) {
    local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar6[3];
  }
  else {
LAB_00149801:
    local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar10;
  }
  local_2b0._M_string_length = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar6 = extraout_RAX_00;
  local_e8 = extraout_RDX_00;
LAB_0014982f:
  local_d8[0]._0_8_ = paVar11->_M_allocated_capacity;
LAB_00149842:
  local_e0 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort((string *)&local_e8);
  puVar6 = extraout_RAX_01;
  paVar10 = extraout_RDX_01;
LAB_00149866:
  local_2e0._M_allocated_capacity = paVar11->_M_allocated_capacity;
  local_2f0 = paVar10;
LAB_00149873:
  local_2e8 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x55b;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar14 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar14 = local_2e0._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_250._M_string_length + local_2e8) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar14 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_250._M_string_length + local_2e8) goto LAB_00149900;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_00149900:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_310 == puVar8) {
    local_300 = *puVar8;
    lStack_2f8 = puVar6[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar8;
  }
  local_308 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar6;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if (local_2d0 == paVar10) {
    local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2c0._8_8_ = puVar6[3];
    local_2d0 = &local_2c0;
  }
  else {
LAB_00149f9d:
    local_2c0._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2c8 = puVar6[1];
  *puVar6 = paVar10;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar11) {
    local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar6[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_0014a0f1:
    local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar6 = extraout_RAX_05;
  paVar10 = extraout_RDX_05;
LAB_0014a11f:
  local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
LAB_0014a12c:
  local_2b0._M_string_length = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar6 = extraout_RAX_06;
  paVar10 = extraout_RDX_06;
LAB_0014a14d:
  local_2b0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
LAB_0014a15a:
  local_2b0._M_string_length = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  Arguments::~Arguments((Arguments *)&local_200);
  if (local_1c0 != (char *)&local_1b0) {
    operator_delete(local_1c0);
  }
  if (local_50 != paVar15) {
    operator_delete(local_50);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}